

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::OptsCommand(UCIAdapter *this,char *param_1)

{
  int iVar1;
  _List_node_base *p_Var2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  _List_node_base *p_Var5;
  Output local_b0;
  string local_a8 [32];
  list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> opts;
  string local_70 [32];
  Output out;
  
  p_Var5 = (_List_node_base *)&opts;
  (*this->engine->_vptr_ChessEngine[5])(p_Var5);
  do {
    while( true ) {
      p_Var5 = (((_List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)
                &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var5 == (_List_node_base *)&opts) {
        std::__cxx11::_List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::
        _M_clear(&opts.super__List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>);
        return;
      }
      p_Var2 = p_Var5 + 1;
      iVar1 = *(int *)&p_Var5[1]._M_prev;
      if (iVar1 - 4U < 2) break;
      if (iVar1 == 3) {
        lVar3 = (**(code **)((long)p_Var2->_M_next + 0x40))(p_Var2);
        Output::Output(&out,InfoPrefix);
        (**(code **)p_Var2->_M_next)(local_a8,p_Var2);
        std::operator<<((ostream *)&std::cout,local_a8);
        std::operator<<((ostream *)&std::cout,':');
        (**(code **)((long)p_Var2->_M_next + 8))(local_70,p_Var2);
        std::operator<<((ostream *)&std::cout,local_70);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_a8);
        for (p_Var4 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
            p_Var4 != (_Rb_tree_node_base *)(lVar3 + 8);
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::operator<<((ostream *)&std::cout,' ');
          std::operator<<((ostream *)&std::cout,(string *)(p_Var4 + 1));
        }
        Output::~Output(&out);
      }
      else if (iVar1 == 2) break;
    }
    Output::Output(&local_b0,InfoPrefix);
    (**(code **)p_Var2->_M_next)(local_a8,p_Var2);
    std::operator<<((ostream *)&std::cout,local_a8);
    std::operator<<((ostream *)&std::cout,':');
    (**(code **)((long)p_Var2->_M_next + 8))(local_70,p_Var2);
    std::operator<<((ostream *)&std::cout,local_70);
    std::operator<<((ostream *)&std::cout,' ');
    (**(code **)((long)p_Var2->_M_next + 0x10))((string *)&out,p_Var2);
    std::operator<<((ostream *)&std::cout,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_a8);
    Output::~Output(&local_b0);
  } while( true );
}

Assistant:

void UCIAdapter::OptsCommand(const char* /*params*/)
{
  std::list<EngineOption> opts = engine->GetOptions();
  std::list<EngineOption>::const_iterator it;
  for (it = opts.begin(); it != opts.end(); ++it) {
    const EngineOption& opt = *it;
    switch (opt.GetType()) {
    case EngineOption::Checkbox:
    case EngineOption::Spin:
    case EngineOption::String:
      Output() << opt.GetTypeName() << ':' << opt.GetName() << ' '
               << opt.GetValue();
      break;
    case EngineOption::ComboBox: {
      const std::set<std::string>& values = opt.GetComboValues();
      std::set<std::string>::const_iterator it;
      Output out;
      out << opt.GetTypeName() << ':' << opt.GetName();
      for (it = values.begin(); it != values.end(); ++it) {
        out << ' ' << *it;
      }
    }
    default:
      break;
    }
  }
}